

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O3

int adios2::utils::readVar<unsigned_short>(Engine *fp,IO *io,Variable<unsigned_short> *variable)

{
  undefined1 auVar1 [16];
  char cVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  size_type __new_size;
  ostream *poVar8;
  uint uVar9;
  ulong uVar10;
  pointer puVar11;
  char *pcVar12;
  pointer *ppuVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  size_t relstep;
  long lVar18;
  long lVar20;
  ulong uVar21;
  bool bVar22;
  Dims dimsign;
  vector<unsigned_short,_std::allocator<unsigned_short>_> dataV;
  uint64_t c [16];
  uint64_t s [16];
  uint64_t count_t [16];
  uint64_t readn [16];
  uint64_t start_t [16];
  int ndigits_dims [32];
  byte local_45c;
  ulong local_458;
  ulong local_438;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_428;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_3f8;
  ulong local_3d8;
  Engine *local_3d0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_3c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_3a8;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_388;
  long local_368;
  string *local_360;
  ulong local_358;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_350;
  pointer local_338 [16];
  pointer *local_2b8 [16];
  ulong local_238 [16];
  ulong auStack_1b8 [16];
  size_t local_138 [16];
  int local_b8 [34];
  ulong uVar19;
  
  local_388.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_388.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_388.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar6 = *(ulong *)(variable + 0x30);
  local_3d0 = fp;
  if (timestep == 1) {
    local_438 = *(long *)(variable + 0x60) - *(long *)(variable + 0x58);
    relstep = 0;
    local_458 = 1;
    uVar9 = 1;
    local_45c = 1;
    uVar4 = 0;
  }
  else {
    uVar9 = adios2::core::VariableBase::GetAvailableStepsCount();
    local_438 = *(long *)(variable + 0x60) - *(long *)(variable + 0x58);
    relstep = 0;
    local_458 = 1;
    local_45c = 1;
    if (((int)uVar9 < 2) || ((timestep & 1) != 0)) {
      uVar4 = 0;
    }
    else {
      uVar4 = uVar9 & 0x7fffffff;
      relstep = (ulong)(uVar4 & (uint)(istart >> 0x3f)) + istart;
      local_458 = ((uVar4 + icount) - relstep) + 1;
      if (-1 < (long)icount) {
        local_458 = icount;
      }
      if (2 < verbose) {
        printf("    j=0, stepStart=%lu stepCount=%lu\n",relstep,local_458);
      }
      if ((ulong)uVar4 < local_458 + relstep) {
        printf("ERROR: The sum of start step (%lu) and step count (%lu) is larger than the number of steps available (%d)\n"
               ,relstep,local_458,(ulong)uVar9);
        iVar3 = -1;
        goto LAB_0013d089;
      }
      uVar4 = 1;
      local_238[0] = local_458;
      local_138[0] = relstep;
      if (verbose < 2) {
        local_45c = 0;
      }
      else {
        local_45c = 0;
        printf("    s[0]=%lu, c[0]=%lu, n=%lu\n",relstep,local_458,local_458);
      }
    }
  }
  sVar5 = relative_to_absolute_step<unsigned_short>(local_3d0,variable,relstep);
  local_3f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (timestep == 1) {
    adios2::core::VariableBase::Shape((ulong)&local_428);
  }
  else {
    adios2::core::VariableBase::Shape((ulong)&local_428);
  }
  puVar11 = local_3f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_3f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_428.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_3f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_428.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_3f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_428.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_428.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_428.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_428.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((puVar11 != (pointer)0x0) &&
     (operator_delete(puVar11),
     (pointer *)
     local_428.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
     super__Vector_impl_data._M_start != (pointer *)0x0)) {
    operator_delete(local_428.first.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_438 = local_438 >> 3;
  if (2 < verbose) {
    printf("    starting step=%lu absolute step=%zu, dims={",relstep,sVar5);
    puVar11 = local_3f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppuVar13 = (pointer *)
                    local_3f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppuVar13 != (pointer *)puVar11;
        ppuVar13 = ppuVar13 + 1) {
      printf("%zu",*ppuVar13);
    }
    puts("}");
  }
  uVar16 = (uint)local_438;
  if (local_45c == 0) {
    get_global_array_signature<unsigned_short>(&local_428.first,local_3d0,io,variable);
    ppuVar13 = (pointer *)
               local_428.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (local_428.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_428.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
LAB_0013c751:
      if (*ppuVar13 != (pointer)0x0) goto code_r0x0013c757;
      if (1 < local_458) {
        puts(
            "ERROR: This variable has a changing shape over time, so bpls cannot dump it as a global array. "
            );
        printf("You can dump a single step with\n    bpls -d %s -s \"T",
               *(undefined8 *)(variable + 8));
        if ((int)uVar16 < 1) {
          printf("\" -c \"1");
        }
        else {
          uVar6 = local_438 & 0xffffffff;
          do {
            printf(",0");
            uVar4 = (int)uVar6 - 1;
            uVar6 = (ulong)uVar4;
          } while (uVar4 != 0);
          printf("\" -c \"1");
          if (0 < (int)uVar16) {
            do {
              printf(",-1");
              uVar4 = (int)local_438 - 1;
              local_438 = (ulong)uVar4;
            } while (uVar4 != 0);
          }
        }
        printf("\"\nwhere T is a number between 0 and %d,\n",(ulong)(uVar9 - 1));
        printf("or dump each block separately with \n    bpls -dD %s\n",
               *(undefined8 *)(variable + 8));
        if ((pointer *)
            local_428.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer *)0x0) {
          operator_delete(local_428.first.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        iVar3 = -1;
        goto LAB_0013d07a;
      }
    }
LAB_0013c7db:
    if ((pointer *)
        local_428.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer *)0x0) {
      operator_delete(local_428.first.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  if (0 < (int)uVar16) {
    local_3d8 = (ulong)uVar4;
    uVar21 = (ulong)(uVar4 * 8);
    uVar14 = 0;
    do {
      lVar20 = uVar21 + uVar14 * 8;
      lVar18 = *(long *)((long)&istart + lVar20);
      if (lVar18 < 0) {
        lVar18 = lVar18 + (long)local_3f8.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar14];
      }
      lVar20 = *(long *)((long)&icount + lVar20);
      if (lVar20 < 0) {
        lVar20 = (long)local_3f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar14] + (lVar20 - lVar18) + 1;
      }
      if (2 < verbose) {
        printf("    j=%d, st=%lu ct=%lu\n",(ulong)(uint)((int)local_3d8 + (int)uVar14),lVar18,lVar20
              );
      }
      iVar3 = verbose;
      *(long *)((long)local_138 + uVar14 * 8 + uVar21) = lVar18;
      *(long *)((long)local_238 + uVar14 * 8 + uVar21) = lVar20;
      local_458 = local_458 * lVar20;
      if (1 < iVar3) {
        uVar9 = (int)local_3d8 + (int)uVar14;
        printf("    s[%d]=%lu, c[%d]=%lu, n=%lu\n",(ulong)uVar9,lVar18,(ulong)uVar9,lVar20,local_458
              );
      }
      uVar14 = uVar14 + 1;
    } while ((uVar16 & 0x7fffffff) != uVar14);
  }
  if (1 < verbose) {
    printf(" total size of data to read = %lu\n",local_458 * uVar6);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_350,&local_3f8);
  print_slice_info((VariableBase *)variable,(bool)(local_45c ^ 1),local_138,local_238,&local_350);
  if (local_350.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_350.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar6;
  uVar6 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xa00000)) / auVar1,0);
  if (local_458 < uVar6) {
    uVar6 = local_458;
  }
  ppuVar13 = &local_428.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_428.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)ppuVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,".xml","");
  local_360 = (string *)(variable + 8);
  cVar2 = adios2::helper::EndsWith(local_360,(string *)&local_428,false);
  if ((pointer *)
      local_428.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != ppuVar13) {
    operator_delete(local_428.first.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  uVar9 = uVar4 + uVar16;
  uVar14 = (ulong)uVar9;
  if (cVar2 != '\0') {
    uVar6 = local_458;
  }
  if (1 < verbose) {
    puts("Read size strategy:");
  }
  uVar21 = (ulong)(uVar9 - 1);
  local_358 = uVar21;
  if ((int)uVar9 < 1) {
    lVar20 = 1;
    uVar15 = 1;
  }
  else {
    uVar15 = 1;
    lVar20 = 1;
    uVar19 = uVar14;
    do {
      if (uVar15 < uVar6) {
        uVar7 = uVar6 / (ulong)(long)(int)uVar15;
        uVar10 = local_238[uVar21];
        if (uVar7 < local_238[uVar21]) {
          uVar10 = uVar7;
        }
        auStack_1b8[uVar21] = uVar10;
      }
      else {
        auStack_1b8[uVar21] = 1;
        uVar10 = 1;
      }
      if (1 < verbose) {
        printf("    dim %d: read %lu elements\n",uVar21 & 0xffffffff,uVar10);
      }
      uVar15 = uVar15 * local_238[uVar21];
      lVar20 = lVar20 * uVar10;
      uVar21 = uVar21 - 1;
      iVar3 = (int)uVar19;
      uVar17 = iVar3 - 1;
      uVar19 = (ulong)uVar17;
    } while (uVar17 != 0 && 0 < iVar3);
  }
  if (1 < verbose) {
    printf("    read %lu elements at once, %lu in total (nelems=%lu)\n",lVar20,uVar15,local_458);
  }
  if (0 < (int)uVar9) {
    uVar6 = 0;
    do {
      local_2b8[uVar6] = (pointer *)local_138[uVar6];
      local_338[uVar6] = (pointer)auStack_1b8[uVar6];
      iVar3 = snprintf(ndigits(unsigned_long)::digitstr,0x20,"%zu",
                       (long)local_138[uVar6] + (local_238[uVar6] - 1));
      local_b8[uVar6] = iVar3;
      uVar6 = uVar6 + 1;
    } while (uVar14 != uVar6);
  }
  if (local_458 != 0) {
    local_368 = (long)local_338 + (ulong)(uVar4 << 3);
    uVar6 = 0;
    do {
      if ((int)uVar9 < 1) {
        lVar20 = 1;
      }
      else {
        lVar20 = 1;
        uVar21 = 0;
        do {
          lVar20 = lVar20 * (long)local_338[uVar21];
          uVar21 = uVar21 + 1;
        } while (uVar14 != uVar21);
      }
      local_3d8 = uVar6;
      if (2 < verbose) {
        printf("adios_read_var name=%s ",*(undefined8 *)local_360);
        printf("%s = { ","  start");
        if ((int)uVar9 < 1) {
          putchar(0x7d);
          printf("%s = { ","  count");
        }
        else {
          uVar6 = 0;
          do {
            printf("%lu ",local_2b8[uVar6]);
            uVar6 = uVar6 + 1;
          } while (uVar14 != uVar6);
          putchar(0x7d);
          printf("%s = { ","  count");
          if (0 < (int)uVar9) {
            uVar6 = 0;
            do {
              printf("%lu ",local_338[uVar6]);
              uVar6 = uVar6 + 1;
            } while (uVar14 != uVar6);
          }
        }
        putchar(0x7d);
        printf("  read %lu elems\n",lVar20);
      }
      if (*(int *)(variable + 0x40) == 2) {
        adios2::helper::Uint64ArrayToSizetVector((ulong)&local_3a8,(ulong *)(long)(int)uVar16);
        if (*(int *)(variable + 0x40) != 2) goto LAB_0013ccdd;
        adios2::helper::Uint64ArrayToSizetVector((ulong)&local_3c8,(ulong *)(long)(int)uVar16);
      }
      else {
        local_3a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_3a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_0013ccdd:
        local_3c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_3c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      if (2 < verbose) {
        printf("set selection: ");
        printf("%s = { ","  start");
        if ((int)uVar16 < 1) {
          putchar(0x7d);
          printf("%s = { ","  count");
        }
        else {
          uVar6 = 0;
          do {
            printf("%zu ",local_3a8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar6]);
            uVar6 = uVar6 + 1;
          } while ((uVar16 & 0x7fffffff) != uVar6);
          putchar(0x7d);
          printf("%s = { ","  count");
          if (0 < (int)uVar16) {
            uVar6 = 0;
            do {
              printf("%zu ",local_3c8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar6]);
              uVar6 = uVar6 + 1;
            } while ((uVar16 & 0x7fffffff) != uVar6);
          }
        }
        putchar(0x7d);
        putchar(10);
      }
      if (*(int *)(variable + 0x40) == 2) {
        std::
        pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::
        pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true>
                  (&local_428,&local_3a8,&local_3c8);
        adios2::core::VariableBase::SetSelection((pair *)variable);
        if (local_428.second.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_428.second.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((pointer *)
            local_428.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer *)0x0) {
          operator_delete(local_428.first.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      if (local_45c == 0) {
        if (2 < verbose) {
          printf("set Step selection: from relative step %lu read %lu steps\n",local_2b8[0],
                 local_338[0]);
        }
        local_428.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_2b8[0];
        local_428.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = local_338[0];
        adios2::core::VariableBase::SetStepSelection((pair *)variable);
      }
      __new_size = adios2::core::Variable<unsigned_short>::SelectionSize();
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize(&local_388,__new_size);
      adios2::core::Engine::Get<unsigned_short>((Variable *)local_3d0,variable,(Mode)&local_388);
      print_dataset(local_388.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,*(DataType *)(variable + 0x28),
                    (uint64_t *)local_2b8,(uint64_t *)local_338,uVar9,local_b8);
      if (0 < (int)uVar9) {
        bVar22 = true;
        uVar6 = uVar14;
        uVar21 = local_358;
        do {
          if (bVar22) {
            uVar15 = local_238[uVar21] + (long)local_138[uVar21];
            bVar22 = (long)local_338[uVar21] + (long)local_2b8[uVar21] == uVar15;
            if (bVar22) {
              local_2b8[uVar21] = (pointer *)local_138[uVar21];
              puVar11 = (pointer)auStack_1b8[uVar21];
            }
            else {
              ppuVar13 = (pointer *)((long)local_2b8[uVar21] + auStack_1b8[uVar21]);
              local_2b8[uVar21] = ppuVar13;
              if ((ulong)((long)local_338[uVar21] + (long)ppuVar13) <= uVar15) goto LAB_0013cf59;
              puVar11 = (pointer)(uVar15 - (long)ppuVar13);
            }
            local_338[uVar21] = puVar11;
          }
          else {
LAB_0013cf59:
            bVar22 = false;
          }
          uVar21 = uVar21 - 1;
          iVar3 = (int)uVar6;
          uVar4 = iVar3 - 1;
          uVar6 = (ulong)uVar4;
        } while (uVar4 != 0 && 0 < iVar3);
      }
      if (local_3c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      uVar6 = local_3d8;
      if (local_3a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      uVar6 = uVar6 + lVar20;
    } while (uVar6 < local_458);
  }
  if (nextcol != 0) {
    fputc(10,outf);
  }
  nextcol = 0;
  iVar3 = 0;
  if (accuracyWasSet == '\x01') {
    adios2::core::VariableBase::GetAccuracy();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Read accuracy was (error = ",0x1b);
    poVar8 = std::ostream::_M_insert<double>
                       ((double)local_428.first.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,", norm = ",9);
    poVar8 = std::ostream::_M_insert<double>
                       ((double)local_428.first.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
    pcVar12 = "abs";
    if ((char)local_428.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage != '\0') {
      pcVar12 = "rel";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar12,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,")\n",2);
    iVar3 = 0;
  }
LAB_0013d07a:
  if ((pointer *)
      local_3f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_3f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
LAB_0013d089:
  if (local_388.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_388.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return iVar3;
code_r0x0013c757:
  ppuVar13 = ppuVar13 + 1;
  if (ppuVar13 ==
      (pointer *)
      local_428.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) goto LAB_0013c7db;
  goto LAB_0013c751;
}

Assistant:

int readVar(core::Engine *fp, core::IO *io, core::Variable<T> *variable)
{
    int i, j;
    uint64_t start_t[MAX_DIMS],
        count_t[MAX_DIMS]; // processed <0 values in start/count
    uint64_t s[MAX_DIMS],
        c[MAX_DIMS]; // for block reading of smaller chunks
    int tdims;       // number of dimensions including time
    int tidx;        // 0 or 1 to account for time dimension
    uint64_t nelems; // number of elements to read
    // size_t elemsize;                   // size in bytes of one element
    uint64_t stepStart, stepCount;
    std::vector<T> dataV;
    uint64_t sum;             // working var to sum up things
    uint64_t maxreadn;        // max number of elements to read once up to a limit
                              // (10MB of data)
    uint64_t actualreadn;     // our decision how much to read at once
    uint64_t readn[MAX_DIMS]; // how big chunk to read in in each dimension?
    int ndigits_dims[32];     // # of digits (to print) of each dimension

    const size_t elemsize = variable->m_ElementSize;
    const int nsteps = (timestep ? 1 : static_cast<int>(variable->GetAvailableStepsCount()));
    const int ndim = static_cast<int>(variable->m_Shape.size());
    // create the counter arrays with the appropriate lengths
    // transfer start and count arrays to format dependent arrays

    nelems = 1;
    tidx = 0;
    stepStart = 0;
    stepCount = 1;

    if (!timestep && nsteps > 1)
    {
        // user selection must start with step selection
        // calculate the starting step and number of steps requested
        if (istart[0] < 0) // negative index means last-|index|
            stepStart = nsteps + istart[0];
        else
            stepStart = istart[0];
        if (icount[0] < 0) // negative index means last-|index|+1-start
            stepCount = nsteps + icount[0] + 1 - stepStart;
        else
            stepCount = icount[0];

        if (verbose > 2)
            printf("    j=0, stepStart=%" PRIu64 " stepCount=%" PRIu64 "\n", stepStart, stepCount);

        if (stepStart + stepCount > static_cast<uint64_t>(nsteps))
        {
            printf("ERROR: The sum of start step (%" PRIu64 ") and step count (%" PRIu64
                   ") is larger "
                   "than the number of steps available (%d)\n",
                   stepStart, stepCount, nsteps);
            return -1;
        }

        start_t[0] = stepStart;
        count_t[0] = stepCount;
        nelems *= stepCount;
        if (verbose > 1)
            printf("    s[0]=%" PRIu64 ", c[0]=%" PRIu64 ", n=%" PRIu64 "\n", start_t[0],
                   count_t[0], nelems);
        tidx = 1;
    }

    tdims = ndim + tidx;

    // Absolute step is needed to access Shape of variable in a step
    // and also for StepSelection
    size_t absstep = relative_to_absolute_step(fp, variable, stepStart);

    // Get the shape of the variable for the starting step
    Dims shape;
    if (timestep)
    {
        shape = variable->Shape();
    }
    else
    {
        shape = variable->Shape(absstep);
    }
    if (verbose > 2)
    {
        printf("    starting step=%" PRIu64 " absolute step=%zu"
               ", dims={",
               stepStart, absstep);
        for (auto dim : shape)
        {
            printf("%zu", dim);
        }
        printf("}\n");
    }

    if (tidx)
    {
        // If shape is changing we still can support printing a single step
        auto dimsign = get_global_array_signature(fp, io, variable);
        bool changingShape = false;
        for (auto d : dimsign)
        {
            if (d == 0)
            {
                changingShape = true;
                break;
            }
        }
        if (changingShape && stepCount > 1)
        {
            printf("ERROR: This variable has a changing shape over time, "
                   "so bpls cannot dump it as a global array. \n");
            printf("You can dump a single step with\n"
                   "    bpls -d %s -s \"T",
                   variable->m_Name.c_str());
            for (j = 0; j < ndim; j++)
            {
                printf(",0");
            }
            printf("\" -c \"1");
            for (j = 0; j < ndim; j++)
            {
                printf(",-1");
            }
            printf("\"\nwhere T is a number between 0 and %d,\n", nsteps - 1);
            printf("or dump each block separately with \n"
                   "    bpls -dD %s\n",
                   variable->m_Name.c_str());
            return -1;
        }
    }

    for (j = 0; j < ndim; j++)
    {
        uint64_t st, ct;
        if (istart[j + tidx] < 0) // negative index means last-|index|
            st = shape[j] + istart[j + tidx];
        else
            st = istart[j + tidx];
        if (icount[j + tidx] < 0) // negative index means last-|index|+1-start
            ct = shape[j] + icount[j + tidx] + 1 - st;
        else
            ct = icount[j + tidx];

        if (verbose > 2)
            printf("    j=%d, st=%" PRIu64 " ct=%" PRIu64 "\n", j + tidx, st, ct);

        start_t[j + tidx] = st;
        count_t[j + tidx] = ct;
        nelems *= ct;
        if (verbose > 1)
            printf("    s[%d]=%" PRIu64 ", c[%d]=%" PRIu64 ", n=%" PRIu64 "\n", j + tidx,
                   start_t[j + tidx], j + tidx, count_t[j + tidx], nelems);
    }

    if (verbose > 1)
    {
        printf(" total size of data to read = %" PRIu64 "\n", nelems * elemsize);
    }

    print_slice_info(variable, (tidx == 1), start_t, count_t, shape);

    maxreadn = (uint64_t)MAX_BUFFERSIZE / elemsize;
    if (nelems < maxreadn)
        maxreadn = nelems;

    bool xmlprint = helper::EndsWith(variable->m_Name, ".xml", false);
    if (xmlprint && nelems > maxreadn)
        maxreadn = nelems;

    // special case: string. Need to use different elemsize
    /*if (vi->type == DataType::String)
    {
        if (vi->value)
            elemsize = strlen(vi->value) + 1;
        maxreadn = elemsize;
    }*/

    // allocate data array
    // data = (T *)malloc(maxreadn * elemsize);

    // determine strategy how to read in:
    //  - at once
    //  - loop over 1st dimension
    //  - loop over 1st & 2nd dimension
    //  - etc
    if (verbose > 1)
        printf("Read size strategy:\n");
    sum = (uint64_t)1;
    actualreadn = (uint64_t)1;
    for (i = tdims - 1; i >= 0; i--)
    {
        if (sum >= (uint64_t)maxreadn)
        {
            readn[i] = 1;
        }
        else
        {
            readn[i] = maxreadn / (int)sum; // sum is small for 4 bytes here
            // this may be over the max count for this dimension
            if (readn[i] > count_t[i])
                readn[i] = count_t[i];
        }
        if (verbose > 1)
            printf("    dim %d: read %" PRIu64 " elements\n", i, readn[i]);
        sum = sum * (uint64_t)count_t[i];
        actualreadn = actualreadn * readn[i];
    }
    if (verbose > 1)
        printf("    read %" PRIu64 " elements at once, %" PRIu64 " in total (nelems=%" PRIu64 ")\n",
               actualreadn, sum, nelems);

    // init s and c
    // and calculate ndigits_dims
    for (j = 0; j < tdims; j++)
    {
        s[j] = start_t[j];
        c[j] = readn[j];

        ndigits_dims[j] =
            ndigits(start_t[j] + count_t[j] - 1); // -1: dim=100 results in 2 digits (0..99)
    }

    // read until read all 'nelems' elements
    sum = 0;
    while (sum < nelems)
    {

        // how many elements do we read in next?
        actualreadn = 1;
        for (j = 0; j < tdims; j++)
            actualreadn *= c[j];

        if (verbose > 2)
        {
            printf("adios_read_var name=%s ", variable->m_Name.c_str());
            PRINT_DIMS_UINT64("  start", s, tdims, j);
            PRINT_DIMS_UINT64("  count", c, tdims, j);
            printf("  read %" PRIu64 " elems\n", actualreadn);
        }

        // read a slice finally
        const Dims startv = variable->m_ShapeID == ShapeID::GlobalArray
                                ? helper::Uint64ArrayToSizetVector(tdims - tidx, s + tidx)
                                : Dims();
        const Dims countv = variable->m_ShapeID == ShapeID::GlobalArray
                                ? helper::Uint64ArrayToSizetVector(tdims - tidx, c + tidx)
                                : Dims();

        if (verbose > 2)
        {
            printf("set selection: ");
            PRINT_DIMS_SIZET("  start", startv.data(), tdims - tidx, j);
            PRINT_DIMS_SIZET("  count", countv.data(), tdims - tidx, j);
            printf("\n");
        }

        if (variable->m_ShapeID == ShapeID::GlobalArray)
        {
            variable->SetSelection({startv, countv});
        }

        if (tidx)
        {
            if (verbose > 2)
            {
                printf("set Step selection: from relative step %" PRIu64 " read %" PRIu64
                       " steps\n",
                       s[0], c[0]);
            }
            variable->SetStepSelection({s[0], c[0]});
        }

        dataV.resize(variable->SelectionSize());
        fp->Get(*variable, dataV, adios2::Mode::Sync);

        // print slice
        print_dataset(dataV.data(), variable->m_Type, s, c, tdims, ndigits_dims);

        // prepare for next read
        sum += actualreadn;
        bool incdim = true; // last dim should be increased
        for (j = tdims - 1; j >= 0; j--)
        {
            if (incdim)
            {
                if (s[j] + c[j] == start_t[j] + count_t[j])
                {
                    // reached the end of this dimension
                    s[j] = start_t[j];
                    c[j] = readn[j];
                    incdim = true; // previous dim can increase too
                }
                else
                {
                    // move up in this dimension up to total count
                    s[j] += readn[j];
                    if (s[j] + c[j] > start_t[j] + count_t[j])
                    {
                        // do not reach over the limit
                        c[j] = start_t[j] + count_t[j] - s[j];
                    }
                    incdim = false;
                }
            }
        }
    } // end while sum < nelems
    print_endline();

    if (accuracyWasSet)
    {
        adios2::Accuracy a = variable->GetAccuracy();
        std::cout << "Read accuracy was (error = " << a.error << ", norm = " << a.norm << ", "
                  << (a.relative ? "rel" : "abs") << ")\n";
    }

    return 0;
}